

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

int __thiscall llvm::SmallVectorImpl<int>::pop_back_val(SmallVectorImpl<int> *this)

{
  int iVar1;
  ulong uVar2;
  
  uVar2 = (ulong)(this->super_SmallVectorTemplateBase<int,_true>).
                 super_SmallVectorTemplateCommon<int,_void>.super_SmallVectorBase.Size;
  if (uVar2 == 0) {
    __assert_fail("!empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                  ,0xae,"reference llvm::SmallVectorTemplateCommon<int>::back() [T = int]");
  }
  if (uVar2 - 1 <=
      (ulong)(this->super_SmallVectorTemplateBase<int,_true>).
             super_SmallVectorTemplateCommon<int,_void>.super_SmallVectorBase.Capacity) {
    iVar1 = *(int *)((long)(this->super_SmallVectorTemplateBase<int,_true>).
                           super_SmallVectorTemplateCommon<int,_void>.super_SmallVectorBase.BeginX +
                    uVar2 * 4 + -4);
    (this->super_SmallVectorTemplateBase<int,_true>).super_SmallVectorTemplateCommon<int,_void>.
    super_SmallVectorBase.Size = (uint)(uVar2 - 1);
    return iVar1;
  }
  __assert_fail("Size <= capacity()",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                ,0x44,"void llvm::SmallVectorBase::set_size(size_t)");
}

Assistant:

LLVM_NODISCARD T pop_back_val() {
    T Result = ::std::move(this->back());
    this->pop_back();
    return Result;
  }